

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined1 uVar1;
  undefined4 uVar2;
  TestContext *pTVar3;
  Context *pCVar4;
  int iVar5;
  IsEnabledVerifier *pIVar6;
  undefined4 extraout_var;
  GetBooleanVerifier *pGVar7;
  undefined4 extraout_var_00;
  GetIntegerVerifier *pGVar8;
  undefined4 extraout_var_01;
  GetInteger64Verifier *pGVar9;
  undefined4 extraout_var_02;
  GetFloatVerifier *pGVar10;
  undefined4 extraout_var_03;
  long *plVar11;
  long lVar12;
  ApiCase *pAVar13;
  long *extraout_RAX;
  long *plVar14;
  int _verifierNdx;
  long lVar15;
  StateVerifier *normalVerifiers [4];
  StateVerifier *isEnabledVerifiers [5];
  long *local_f0;
  long local_e0;
  long lStack_d8;
  long *local_d0 [2];
  long local_c0 [2];
  BooleanStateQueryTests *local_b0;
  allocator<char> local_a1;
  ApiCase *local_a0;
  GetBooleanVerifier *local_98;
  GetIntegerVerifier *local_90;
  GetInteger64Verifier *local_88;
  GetFloatVerifier *local_80;
  long local_70;
  long local_68;
  TestContext *local_60;
  IsEnabledVerifier *local_58;
  GetBooleanVerifier *local_50;
  GetIntegerVerifier *local_48;
  GetInteger64Verifier *local_40;
  GetFloatVerifier *local_38;
  
  pIVar6 = (IsEnabledVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pIVar6->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pIVar6->super_StateVerifier).m_testNamePostfix = "_isenabled";
  (pIVar6->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pIVar6->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d078b0;
  this->m_verifierIsEnabled = pIVar6;
  pGVar7 = (GetBooleanVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar7->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar7->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar7->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar7->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d078e0;
  this->m_verifierBoolean = pGVar7;
  pGVar8 = (GetIntegerVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar8->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar8->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar8->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar8->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d07910;
  this->m_verifierInteger = pGVar8;
  pGVar9 = (GetInteger64Verifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar9->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_02,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar9->super_StateVerifier).m_testNamePostfix = "_getinteger64";
  (pGVar9->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar9->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d07940;
  this->m_verifierInteger64 = pGVar9;
  pGVar10 = (GetFloatVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar10->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_03,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar10->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar10->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar10->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_00d07970;
  this->m_verifierFloat = pGVar10;
  local_58 = this->m_verifierIsEnabled;
  local_50 = this->m_verifierBoolean;
  local_48 = this->m_verifierInteger;
  local_40 = this->m_verifierInteger64;
  local_38 = pGVar10;
  local_98 = this->m_verifierBoolean;
  local_90 = this->m_verifierInteger;
  local_88 = this->m_verifierInteger64;
  local_80 = pGVar10;
  lVar12 = 0;
  local_b0 = this;
  do {
    lVar15 = 0;
    local_70 = lVar12;
    do {
      local_f0 = &local_e0;
      pTVar3 = (TestContext *)(&local_58)[lVar15];
      local_a0 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d0,(&PTR_anon_var_dwarf_834a6b_00d079d0)[lVar12 * 3],&local_a1);
      plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
      pAVar13 = local_a0;
      plVar14 = plVar11 + 2;
      if ((long *)*plVar11 == plVar14) {
        local_e0 = *plVar14;
        lStack_d8 = plVar11[3];
      }
      else {
        local_e0 = *plVar14;
        local_f0 = (long *)*plVar11;
      }
      *plVar11 = (long)plVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar2 = (&DAT_00d079e0)[lVar12 * 6];
      uVar1 = (&DAT_00d079e4)[lVar12 * 0x18];
      local_68 = lVar15;
      local_60 = pTVar3;
      ApiCase::ApiCase(local_a0,pCVar4,(char *)local_f0,(char *)(&DAT_00d079d8)[lVar12 * 3]);
      this = local_b0;
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00d07ba0;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar2
      ;
      *(undefined1 *)
       ((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar1;
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = local_60;
      tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      lVar15 = local_68;
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 5);
    lVar12 = local_70 + 1;
  } while (lVar12 != 0xb);
  lVar12 = 0;
  do {
    pGVar7 = (&local_98)[lVar12];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_b0->super_TestCaseGroup).m_context;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"color_writemask","");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_f0 = &local_e0;
    plVar14 = plVar11 + 2;
    if ((long *)*plVar11 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar11[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar11;
    }
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_f0,"COLOR_WRITEMASK");
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d07bf8;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar7 = (&local_98)[lVar12];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_b0->super_TestCaseGroup).m_context;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"depth_writemask","");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_f0 = &local_e0;
    plVar14 = plVar11 + 2;
    if ((long *)*plVar11 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar11[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar11;
    }
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_f0,"DEPTH_WRITEMASK");
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d07c50;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar7 = (&local_98)[lVar12];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_b0->super_TestCaseGroup).m_context;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"sample_coverage_invert","");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_f0 = &local_e0;
    plVar14 = plVar11 + 2;
    if ((long *)*plVar11 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar11[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar11;
    }
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_f0,"SAMPLE_COVERAGE_INVERT");
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d07ca8;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pTVar3 = (TestContext *)(&local_98)[lVar12];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_b0->super_TestCaseGroup).m_context;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"shader_compiler","");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_f0 = &local_e0;
    plVar14 = plVar11 + 2;
    if ((long *)*plVar11 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar11[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar11;
    }
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_f0,"SHADER_COMPILER");
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d07d00;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8dfa;
    *(undefined1 *)
     ((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 1;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pTVar3 = (TestContext *)(&local_98)[lVar12];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_b0->super_TestCaseGroup).m_context;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"transform_feedback_active_initial","");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_f0 = &local_e0;
    plVar14 = plVar11 + 2;
    if ((long *)*plVar11 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar11[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar11;
    }
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_f0,"initial TRANSFORM_FEEDBACK_ACTIVE");
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d07d00;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8e24;
    *(undefined1 *)
     ((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pTVar3 = (TestContext *)(&local_98)[lVar12];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_b0->super_TestCaseGroup).m_context;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"transform_feedback_paused_initial","");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_f0 = &local_e0;
    plVar14 = plVar11 + 2;
    if ((long *)*plVar11 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar11[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar11;
    }
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_f0,"initial TRANSFORM_FEEDBACK_PAUSED");
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d07d00;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8e23;
    *(undefined1 *)
     ((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar7 = (&local_98)[lVar12];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_b0->super_TestCaseGroup).m_context;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"transform_feedback","");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_f0 = &local_e0;
    plVar14 = plVar11 + 2;
    if ((long *)*plVar11 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar11[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar11;
    }
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_f0,
                     "Test TRANSFORM_FEEDBACK_ACTIVE and TRANSFORM_FEEDBACK_PAUSED");
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d07d58;
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    pGVar7 = (&local_98)[lVar12];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (local_b0->super_TestCaseGroup).m_context;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"transform_feedback_implicit_resume","");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_f0 = &local_e0;
    plVar14 = plVar11 + 2;
    if ((long *)*plVar11 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar11[3];
    }
    else {
      local_e0 = *plVar14;
      local_f0 = (long *)*plVar11;
    }
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_f0,
                     "EndTransformFeedback performs an implicit ResumeTransformFeedback.");
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00d07dd0;
    tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pAVar13);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    plVar11 = local_c0;
    if (local_d0[0] != plVar11) {
      operator_delete(local_d0[0],local_c0[0] + 1);
      plVar11 = extraout_RAX;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  return (int)plVar11;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierIsEnabled == DE_NULL);
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierIsEnabled		= new IsEnabledVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* isEnabledVerifiers[] = {m_verifierIsEnabled, m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};
	StateVerifier* normalVerifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		bool			value;
	};
	const StateBoolean isEnableds[] =
	{
		{ "primitive_restart_fixed_index",	"PRIMITIVE_RESTART_FIXED_INDEX",	GL_PRIMITIVE_RESTART_FIXED_INDEX,	false},
		{ "rasterizer_discard",				"RASTERIZER_DISCARD",				GL_RASTERIZER_DISCARD,				false},
		{ "cull_face",						"CULL_FACE",						GL_CULL_FACE,						false},
		{ "polygon_offset_fill",			"POLYGON_OFFSET_FILL",				GL_POLYGON_OFFSET_FILL,				false},
		{ "sample_alpha_to_coverage",		"SAMPLE_ALPHA_TO_COVERAGE",			GL_SAMPLE_ALPHA_TO_COVERAGE,		false},
		{ "sample_coverage",				"SAMPLE_COVERAGE",					GL_SAMPLE_COVERAGE,					false},
		{ "scissor_test",					"SCISSOR_TEST",						GL_SCISSOR_TEST,					false},
		{ "stencil_test",					"STENCIL_TEST",						GL_STENCIL_TEST,					false},
		{ "depth_test",						"DEPTH_TEST",						GL_DEPTH_TEST,						false},
		{ "blend",							"BLEND",							GL_BLEND,							false},
		{ "dither",							"DITHER",							GL_DITHER,							true },
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
	{
		FOR_EACH_VERIFIER(isEnabledVerifiers, addChild(new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + verifier->getTestNamePostfix()).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ColorMaskTestCase							(m_context, verifier, (std::string("color_writemask")						+ verifier->getTestNamePostfix()).c_str(), "COLOR_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthWriteMaskTestCase						(m_context, verifier, (std::string("depth_writemask")						+ verifier->getTestNamePostfix()).c_str(), "DEPTH_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SampleCoverageInvertTestCase				(m_context, verifier, (std::string("sample_coverage_invert")				+ verifier->getTestNamePostfix()).c_str(), "SAMPLE_COVERAGE_INVERT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("shader_compiler")						+ verifier->getTestNamePostfix()).c_str(), "SHADER_COMPILER",						GL_SHADER_COMPILER, true)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("transform_feedback_active_initial")		+ verifier->getTestNamePostfix()).c_str(), "initial TRANSFORM_FEEDBACK_ACTIVE",		GL_TRANSFORM_FEEDBACK_ACTIVE, false)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("transform_feedback_paused_initial")		+ verifier->getTestNamePostfix()).c_str(), "initial TRANSFORM_FEEDBACK_PAUSED",		GL_TRANSFORM_FEEDBACK_PAUSED, false)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new TransformFeedbackBasicTestCase				(m_context, verifier, (std::string("transform_feedback")					+ verifier->getTestNamePostfix()).c_str())));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new TransformFeedbackImplicitResumeTestCase		(m_context, verifier, (std::string("transform_feedback_implicit_resume")	+ verifier->getTestNamePostfix()).c_str())));
}